

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_rangeproof_sign
              (secp256k1_context *ctx,uchar *proof,size_t *plen,uint64_t min_value,
              secp256k1_pedersen_commitment *commit,uchar *blind,uchar *nonce,int exp,int min_bits,
              uint64_t value,uchar *message,size_t msg_len,uchar *extra_commit,
              size_t extra_commit_len,secp256k1_generator *gen)

{
  int iVar1;
  undefined1 local_118 [8];
  secp256k1_ge genp;
  secp256k1_ge commitp;
  uchar *blind_local;
  secp256k1_pedersen_commitment *commit_local;
  uint64_t min_value_local;
  size_t *plen_local;
  uchar *proof_local;
  secp256k1_context *ctx_local;
  
  if (proof == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"proof != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (plen == (size_t *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"plen != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (commit == (secp256k1_pedersen_commitment *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"commit != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (blind == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"blind != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (nonce == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"nonce != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (message == (uchar *)0x0 && msg_len != 0) {
    secp256k1_callback_call(&ctx->illegal_callback,"message != NULL || msg_len == 0");
    ctx_local._4_4_ = 0;
  }
  else if (extra_commit == (uchar *)0x0 && extra_commit_len != 0) {
    secp256k1_callback_call(&ctx->illegal_callback,"extra_commit != NULL || extra_commit_len == 0");
    ctx_local._4_4_ = 0;
  }
  else if (gen == (secp256k1_generator *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"gen != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    iVar1 = secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx);
    if (iVar1 == 0) {
      secp256k1_callback_call
                (&ctx->illegal_callback,
                 "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)");
      ctx_local._4_4_ = 0;
    }
    else {
      secp256k1_pedersen_commitment_load((secp256k1_ge *)&genp.infinity,commit);
      secp256k1_generator_load((secp256k1_ge *)local_118,gen);
      ctx_local._4_4_ =
           secp256k1_rangeproof_sign_impl
                     (&ctx->ecmult_gen_ctx,proof,plen,min_value,(secp256k1_ge *)&genp.infinity,blind
                      ,nonce,exp,min_bits,value,message,msg_len,extra_commit,extra_commit_len,
                      (secp256k1_ge *)local_118);
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_rangeproof_sign(const secp256k1_context* ctx, unsigned char *proof, size_t *plen, uint64_t min_value,
 const secp256k1_pedersen_commitment *commit, const unsigned char *blind, const unsigned char *nonce, int exp, int min_bits, uint64_t value,
 const unsigned char *message, size_t msg_len, const unsigned char *extra_commit, size_t extra_commit_len, const secp256k1_generator* gen){
    secp256k1_ge commitp;
    secp256k1_ge genp;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(proof != NULL);
    ARG_CHECK(plen != NULL);
    ARG_CHECK(commit != NULL);
    ARG_CHECK(blind != NULL);
    ARG_CHECK(nonce != NULL);
    ARG_CHECK(message != NULL || msg_len == 0);
    ARG_CHECK(extra_commit != NULL || extra_commit_len == 0);
    ARG_CHECK(gen != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    secp256k1_pedersen_commitment_load(&commitp, commit);
    secp256k1_generator_load(&genp, gen);
    return secp256k1_rangeproof_sign_impl(&ctx->ecmult_gen_ctx,
     proof, plen, min_value, &commitp, blind, nonce, exp, min_bits, value, message, msg_len, extra_commit, extra_commit_len, &genp);
}